

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali_variant.c
# Opt level: O3

int cali_variant_compare(cali_variant_t lhs,cali_variant_t rhs)

{
  uint uVar1;
  ulong uVar2;
  anon_union_8_7_33918203_for_value __s2;
  int iVar3;
  int iVar4;
  uint uVar5;
  anon_union_8_7_33918203_for_value __s1;
  int iVar6;
  ulong uVar7;
  
  __s2 = rhs.value;
  __s1 = lhs.value;
  uVar2 = lhs.type_and_size & 0xff;
  if (9 < uVar2) {
    uVar2 = 0;
  }
  uVar7 = rhs.type_and_size & 0xff;
  iVar4 = (int)uVar7;
  if (9 < uVar7) {
    iVar4 = 0;
  }
  iVar4 = (int)uVar2 - iVar4;
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = rhs.type_and_size._4_4_;
  iVar6 = lhs.type_and_size._4_4_;
  uVar5 = 0;
  switch(uVar2) {
  case 1:
    iVar3 = iVar4;
    if (iVar6 < iVar4) {
      iVar3 = iVar6;
    }
    uVar1 = memcmp(__s1.unmanaged_ptr,__s2.unmanaged_ptr,(long)iVar3);
    goto LAB_00191c91;
  case 3:
  case 5:
    uVar5 = -(uint)(__s1.v_uint < __s2.v_uint) | 1;
    if (__s1.v_uint == __s2.v_uint) {
      uVar5 = 0;
    }
    break;
  case 4:
    iVar3 = iVar4;
    if (iVar6 < iVar4) {
      iVar3 = iVar6;
    }
    uVar1 = strncmp((char *)__s1.unmanaged_ptr,(char *)__s2.unmanaged_ptr,(long)iVar3);
LAB_00191c91:
    uVar5 = iVar6 - iVar4;
    if (uVar1 != 0) {
      uVar5 = uVar1;
    }
    break;
  case 6:
    uVar5 = 0xffffffff;
    if (0.0 <= __s1.v_double - __s2.v_double) {
      uVar5 = (uint)(0.0 < __s1.v_double - __s2.v_double);
    }
    break;
  case 7:
    __s1._0_4_ = lhs.value._0_4_ & 1;
    __s1.v_uint._4_4_ = 0;
    __s2._0_4_ = rhs.value._0_4_ & 1;
    __s2.v_uint._4_4_ = 0;
  case 0:
  case 2:
  case 8:
  case 9:
    uVar5 = __s1.v_type - __s2.v_type;
  }
  return uVar5;
}

Assistant:

int cali_variant_compare(cali_variant_t lhs, cali_variant_t rhs)
{
    uint64_t       t       = _EXTRACT_TYPE(lhs.type_and_size);
    cali_attr_type lhstype = (t <= CALI_MAXTYPE ? (cali_attr_type) t : CALI_TYPE_INV);
    t                      = _EXTRACT_TYPE(rhs.type_and_size);
    cali_attr_type rhstype = (t <= CALI_MAXTYPE ? (cali_attr_type) t : CALI_TYPE_INV);

    if (lhstype == rhstype) {
        switch (lhstype) {
        case CALI_TYPE_INV:
            return lhs.value.v_int - rhs.value.v_int;
        case CALI_TYPE_USR:
            {
                int lhssize = (int) _EXTRACT_SIZE(lhs.type_and_size);
                int rhssize = (int) _EXTRACT_SIZE(rhs.type_and_size);
                int cmp = memcmp(lhs.value.unmanaged_const_ptr, rhs.value.unmanaged_const_ptr, imin(lhssize, rhssize));

                return (cmp ? cmp : (lhssize - rhssize));
            }
        case CALI_TYPE_STRING:
            {
                int lhssize = (int) _EXTRACT_SIZE(lhs.type_and_size);
                int rhssize = (int) _EXTRACT_SIZE(rhs.type_and_size);
                int cmp = strncmp(lhs.value.unmanaged_const_ptr, rhs.value.unmanaged_const_ptr, imin(lhssize, rhssize));

                return (cmp ? cmp : (lhssize - rhssize));
            }
        case CALI_TYPE_INT:
            return lhs.value.v_int - rhs.value.v_int;
        case CALI_TYPE_ADDR:
        case CALI_TYPE_UINT:
            {
                uint64_t diff = lhs.value.v_uint - rhs.value.v_uint;
                return (diff == 0 ? 0 : (diff > lhs.value.v_uint ? -1 : 1));
            }
        case CALI_TYPE_DOUBLE:
            {
                double diff = lhs.value.v_double - rhs.value.v_double;
                return (diff < 0.0 ? -1 : (diff > 0.0 ? 1 : 0));
            }
        case CALI_TYPE_BOOL:
            {
                return (lhs.value.v_bool ? 1 : 0) - (rhs.value.v_bool ? 1 : 0);
            }
        case CALI_TYPE_TYPE:
            return ((int) lhs.value.v_type) - ((int) rhs.value.v_type);
        case CALI_TYPE_PTR:
            return (int) ((char const*) (lhs.value.unmanaged_ptr) - (char const*) (rhs.value.unmanaged_ptr));
        }
    }

    return ((int) lhstype) - ((int) rhstype);
}